

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleManager.cpp
# Opt level: O0

void __thiscall luna::ModuleManager::LoadString(ModuleManager *this,string *str,string *name)

{
  String *module;
  Lexer *in_RDI;
  Lexer lexer;
  InStringStream is;
  string *in_stack_ffffffffffffff08;
  CharInStream *in;
  State *in_stack_ffffffffffffff20;
  State *state;
  Lexer *in_stack_ffffffffffffff30;
  
  io::text::InStringStream::InStringStream((InStringStream *)in_RDI,in_stack_ffffffffffffff08);
  in = *(CharInStream **)&in_RDI->state_;
  module = State::GetString(in_stack_ffffffffffffff20,(string *)in);
  state = (State *)&stack0xffffffffffffffc0;
  std::function<int()>::
  function<luna::ModuleManager::LoadString(std::__cxx11::string_const&,std::__cxx11::string_const&)::__0,void>
            ((function<int_()> *)module,(anon_class_8_1_3fcf65e8 *)in);
  Lexer::Lexer(in_stack_ffffffffffffff30,state,module,in);
  std::function<int_()>::~function((function<int_()> *)0x182776);
  Load((ModuleManager *)in_stack_ffffffffffffff30,(Lexer *)state);
  Lexer::~Lexer(in_RDI);
  io::text::InStringStream::~InStringStream((InStringStream *)0x18279e);
  return;
}

Assistant:

void ModuleManager::LoadString(const std::string &str, const std::string &name)
    {
        io::text::InStringStream is(str);
        Lexer lexer(state_, state_->GetString(name),
                    [&is] () { return is.GetChar(); });
        Load(lexer);
    }